

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<double,_3,_3>::Matrix(Matrix<double,_3,_3> *this)

{
  long lVar1;
  int row;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  Vector<tcu::Vector<double,_3>,_3>::Vector(&this->m_data);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
      uVar4 = 0x3ff00000;
      if (lVar1 != lVar3) {
        uVar4 = 0;
      }
      *(ulong *)((long)this + lVar3) = (ulong)uVar4 << 0x20;
    }
    this = (Matrix<double,_3,_3> *)((long)this + 8);
    lVar1 = lVar1 + 0x18;
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}